

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_has_any_or_all.cpp
# Opt level: O1

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::ListHasAnyOrAllBind
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  string *this_00;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  pointer pcVar3;
  ScalarFunction *pSVar4;
  undefined1 auVar5 [8];
  element_type *peVar6;
  undefined8 uVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  reference pvVar12;
  pointer pEVar13;
  pointer pEVar14;
  reference pvVar15;
  LogicalType *pLVar16;
  LogicalType *pLVar17;
  ParameterNotResolvedException *this_01;
  BinderException *this_02;
  pointer *__ptr;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  LogicalType common_child;
  undefined1 local_118 [8];
  undefined8 local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_108;
  undefined1 local_f8 [16];
  optional_idx local_e8;
  LogicalType LStack_e0;
  __uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_> local_c8;
  LogicalType local_c0;
  LogicalType local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  local_e8.index = (idx_t)bound_function;
  pvVar12 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::operator[](arguments,0);
  local_f8._8_8_ =
       (pvVar12->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
       _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
       .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (pvVar12->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
  BoundCastExpression::AddArrayCastToList
            ((BoundCastExpression *)local_118,context,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             (local_f8 + 8));
  pvVar12 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::operator[](arguments,0);
  auVar5 = local_118;
  local_118 = (undefined1  [8])0x0;
  _Var1._M_head_impl =
       (pvVar12->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
       _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
       .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (pvVar12->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)auVar5;
  if (_Var1._M_head_impl != (Expression *)0x0) {
    (**(code **)(*(long *)&(_Var1._M_head_impl)->super_BaseExpression + 8))();
  }
  if (local_118 != (undefined1  [8])0x0) {
    (**(code **)(*(_func_int **)local_118 + 8))();
  }
  local_118 = (undefined1  [8])0x0;
  if ((Expression *)local_f8._8_8_ != (Expression *)0x0) {
    (**(code **)(*(long *)local_f8._8_8_ + 8))();
  }
  local_f8._8_8_ = 0;
  pvVar12 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::operator[](arguments,1);
  local_f8._0_8_ =
       (pvVar12->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
       _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
       .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (pvVar12->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
  BoundCastExpression::AddArrayCastToList
            ((BoundCastExpression *)local_118,context,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             local_f8);
  pvVar12 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::operator[](arguments,1);
  auVar5 = local_118;
  local_118 = (undefined1  [8])0x0;
  _Var1._M_head_impl =
       (pvVar12->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
       _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
       .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (pvVar12->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)auVar5;
  if (_Var1._M_head_impl != (Expression *)0x0) {
    (**(code **)(*(long *)&(_Var1._M_head_impl)->super_BaseExpression + 8))();
  }
  if (local_118 != (undefined1  [8])0x0) {
    (**(code **)(*(_func_int **)local_118 + 8))();
  }
  local_118 = (undefined1  [8])0x0;
  if ((Expression *)local_f8._0_8_ != (Expression *)0x0) {
    (**(code **)(*(long *)local_f8._0_8_ + 8))();
  }
  local_f8._0_8_ = 0;
  LStack_e0.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)context;
  local_c8._M_t.
  super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
  super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl =
       (tuple<duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)
       (tuple<duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)this;
  pvVar12 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::operator[](arguments,0);
  pEVar13 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
            operator->(pvVar12);
  iVar10 = (*(pEVar13->super_BaseExpression)._vptr_BaseExpression[6])(pEVar13);
  pvVar12 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::operator[](arguments,1);
  pEVar13 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
            operator->(pvVar12);
  iVar11 = (*(pEVar13->super_BaseExpression)._vptr_BaseExpression[6])(pEVar13);
  if ((byte)((byte)iVar10 & (byte)iVar11) == 1) {
    this_01 = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
    ParameterNotResolvedException::ParameterNotResolvedException(this_01);
    __cxa_throw(this_01,&ParameterNotResolvedException::typeinfo,
                ::std::runtime_error::~runtime_error);
  }
  pvVar12 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::operator[](arguments,0);
  pEVar13 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
            operator->(pvVar12);
  pvVar12 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::operator[](arguments,1);
  pEVar14 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
            operator->(pvVar12);
  pLVar16 = &pEVar14->return_type;
  this_00 = (string *)(local_e8.index + 0x48);
  pvVar15 = vector<duckdb::LogicalType,_true>::operator[]
                      ((vector<duckdb::LogicalType,_true> *)this_00,0);
  if ((byte)iVar10 == 0) {
    pLVar17 = &pEVar13->return_type;
    if ((byte)iVar11 == 0) {
      if (pvVar15 != pLVar17) {
        pvVar15->id_ = (pEVar13->return_type).id_;
        pvVar15->physical_type_ = (pEVar13->return_type).physical_type_;
        shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                  (&pvVar15->type_info_,&(pEVar13->return_type).type_info_);
      }
      pvVar15 = vector<duckdb::LogicalType,_true>::operator[]
                          ((vector<duckdb::LogicalType,_true> *)this_00,1);
      if (pvVar15 != pLVar16) {
        pvVar15->id_ = (pEVar14->return_type).id_;
        pvVar15->physical_type_ = (pEVar14->return_type).physical_type_;
        shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                  (&pvVar15->type_info_,&(pEVar14->return_type).type_info_);
      }
      pvVar15 = vector<duckdb::LogicalType,_true>::operator[]
                          ((vector<duckdb::LogicalType,_true> *)this_00,0);
      pLVar16 = ListType::GetChildType(pvVar15);
      pvVar15 = vector<duckdb::LogicalType,_true>::operator[]
                          ((vector<duckdb::LogicalType,_true> *)this_00,1);
      pLVar17 = ListType::GetChildType(pvVar15);
      LogicalType::LogicalType((LogicalType *)local_118,SQLNULL);
      bVar8 = LogicalType::operator==(pLVar16,(LogicalType *)local_118);
      if (bVar8) {
LAB_01bd1776:
        bVar9 = false;
      }
      else {
        LogicalType::LogicalType(&local_a8,SQLNULL);
        bVar9 = LogicalType::operator==(pLVar17,&local_a8);
        if (bVar9) goto LAB_01bd1776;
        bVar9 = LogicalType::operator==(pLVar16,pLVar17);
        bVar9 = !bVar9;
      }
      if (!bVar8) {
        LogicalType::~LogicalType(&local_a8);
      }
      LogicalType::~LogicalType((LogicalType *)local_118);
      if (bVar9) {
        LogicalType::LogicalType(&local_c0);
        bVar8 = LogicalType::TryGetMaxLogicalType
                          ((ClientContext *)
                           LStack_e0.type_info_.internal.
                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi,pLVar16,pLVar17,&local_c0);
        if (!bVar8) {
          this_02 = (BinderException *)__cxa_allocate_exception(0x10);
          local_118 = (undefined1  [8])&aStack_108;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_118,
                     "\'%s\' cannot compare lists of different types: \'%s\' and \'%s\'","");
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          pcVar3 = (((string *)(local_e8.index + 8))->_M_dataplus)._M_p;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_90,pcVar3,
                     pcVar3 + (long)(((string *)(local_e8.index + 0x10))->_M_dataplus)._M_p);
          LogicalType::ToString_abi_cxx11_(&local_50,pLVar16);
          LogicalType::ToString_abi_cxx11_(&local_70,pLVar17);
          BinderException::
          BinderException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                    (this_02,(string *)local_118,&local_90,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_70)
          ;
          __cxa_throw(this_02,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        LogicalType::LIST((LogicalType *)local_118,&local_c0);
        pvVar15 = vector<duckdb::LogicalType,_true>::operator[]
                            ((vector<duckdb::LogicalType,_true> *)this_00,0);
        uVar7 = aStack_108._M_allocated_capacity;
        peVar6 = local_110;
        pvVar15->id_ = (LogicalTypeId)local_118[0];
        pvVar15->physical_type_ = local_118[1];
        uVar18 = *(undefined4 *)
                  &(pvVar15->type_info_).internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        uVar19 = *(undefined4 *)
                  ((long)&(pvVar15->type_info_).internal.
                          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr + 4);
        pSVar4 = (ScalarFunction *)
                 (pvVar15->type_info_).internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        uVar20 = *(undefined4 *)
                  &(pvVar15->type_info_).internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi;
        uVar21 = *(undefined4 *)
                  ((long)&(pvVar15->type_info_).internal.
                          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi + 4);
        (pvVar15->type_info_).internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        (pvVar15->type_info_).internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_110 = (element_type *)0x0;
        aStack_108._M_allocated_capacity = 0;
        p_Var2 = (pvVar15->type_info_).internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        (pvVar15->type_info_).internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar6;
        (pvVar15->type_info_).internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7;
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          local_e8.index = (idx_t)pSVar4;
          LStack_e0._0_4_ = uVar20;
          LStack_e0._4_4_ = uVar21;
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
          uVar18 = (undefined4)local_e8.index;
          uVar19 = local_e8.index._4_4_;
          uVar20 = LStack_e0._0_4_;
          uVar21 = LStack_e0._4_4_;
        }
        uVar7 = aStack_108._M_allocated_capacity;
        local_110 = (element_type *)CONCAT44(uVar19,uVar18);
        aStack_108._M_allocated_capacity._4_4_ = uVar21;
        aStack_108._M_local_buf[0] = (LogicalTypeId)uVar20;
        aStack_108._M_local_buf[1] = SUB41(uVar20,1);
        aStack_108._M_allocated_capacity._2_2_ = SUB42(uVar20,2);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7 !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7);
        }
        LogicalType::~LogicalType((LogicalType *)local_118);
        LogicalType::LIST((LogicalType *)local_118,&local_c0);
        pvVar15 = vector<duckdb::LogicalType,_true>::operator[]
                            ((vector<duckdb::LogicalType,_true> *)this_00,1);
        uVar7 = aStack_108._M_allocated_capacity;
        peVar6 = local_110;
        pvVar15->id_ = (LogicalTypeId)local_118[0];
        pvVar15->physical_type_ = local_118[1];
        uVar18 = *(undefined4 *)
                  &(pvVar15->type_info_).internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        uVar19 = *(undefined4 *)
                  ((long)&(pvVar15->type_info_).internal.
                          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr + 4);
        pSVar4 = (ScalarFunction *)
                 (pvVar15->type_info_).internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        uVar20 = *(undefined4 *)
                  &(pvVar15->type_info_).internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi;
        uVar21 = *(undefined4 *)
                  ((long)&(pvVar15->type_info_).internal.
                          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi + 4);
        (pvVar15->type_info_).internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        (pvVar15->type_info_).internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_110 = (element_type *)0x0;
        aStack_108._M_allocated_capacity = 0;
        p_Var2 = (pvVar15->type_info_).internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        (pvVar15->type_info_).internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar6;
        (pvVar15->type_info_).internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7;
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          local_e8.index = (idx_t)pSVar4;
          LStack_e0._0_4_ = uVar20;
          LStack_e0._4_4_ = uVar21;
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
          uVar18 = (undefined4)local_e8.index;
          uVar19 = local_e8.index._4_4_;
          uVar20 = LStack_e0._0_4_;
          uVar21 = LStack_e0._4_4_;
        }
        uVar7 = aStack_108._M_allocated_capacity;
        local_110 = (element_type *)CONCAT44(uVar19,uVar18);
        aStack_108._M_allocated_capacity._4_4_ = uVar21;
        aStack_108._M_local_buf[0] = (LogicalTypeId)uVar20;
        aStack_108._M_local_buf[1] = SUB41(uVar20,1);
        aStack_108._M_allocated_capacity._2_2_ = SUB42(uVar20,2);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7 !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7);
        }
        LogicalType::~LogicalType((LogicalType *)local_118);
        LogicalType::~LogicalType(&local_c0);
      }
      goto LAB_01bd18be;
    }
    if (pvVar15 != pLVar17) {
      pvVar15->id_ = (pEVar13->return_type).id_;
      pvVar15->physical_type_ = (pEVar13->return_type).physical_type_;
      shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                (&pvVar15->type_info_,&(pEVar13->return_type).type_info_);
    }
    pvVar15 = vector<duckdb::LogicalType,_true>::operator[]
                        ((vector<duckdb::LogicalType,_true> *)this_00,1);
    if (pvVar15 == pLVar17) goto LAB_01bd18be;
    pvVar15->id_ = (pEVar13->return_type).id_;
    pvVar15->physical_type_ = (pEVar13->return_type).physical_type_;
  }
  else {
    if (pvVar15 != pLVar16) {
      pvVar15->id_ = (pEVar14->return_type).id_;
      pvVar15->physical_type_ = (pEVar14->return_type).physical_type_;
      shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                (&pvVar15->type_info_,&(pEVar14->return_type).type_info_);
    }
    pvVar15 = vector<duckdb::LogicalType,_true>::operator[]
                        ((vector<duckdb::LogicalType,_true> *)this_00,1);
    if (pvVar15 == pLVar16) goto LAB_01bd18be;
    pvVar15->id_ = (pEVar14->return_type).id_;
    pvVar15->physical_type_ = (pEVar14->return_type).physical_type_;
    pEVar13 = pEVar14;
  }
  shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
            (&pvVar15->type_info_,&(pEVar13->return_type).type_info_);
LAB_01bd18be:
  *(undefined8 *)
   local_c8._M_t.
   super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
   super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl = 0;
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (_Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)
         local_c8._M_t.
         super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
         super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
}

Assistant:

static unique_ptr<FunctionData> ListHasAnyOrAllBind(ClientContext &context, ScalarFunction &bound_function,
                                                    vector<unique_ptr<Expression>> &arguments) {

	arguments[0] = BoundCastExpression::AddArrayCastToList(context, std::move(arguments[0]));
	arguments[1] = BoundCastExpression::AddArrayCastToList(context, std::move(arguments[1]));

	const auto lhs_is_param = arguments[0]->HasParameter();
	const auto rhs_is_param = arguments[1]->HasParameter();

	if (lhs_is_param && rhs_is_param) {
		throw ParameterNotResolvedException();
	}

	const auto &lhs_list = arguments[0]->return_type;
	const auto &rhs_list = arguments[1]->return_type;

	if (lhs_is_param) {
		bound_function.arguments[0] = rhs_list;
		bound_function.arguments[1] = rhs_list;
		return nullptr;
	}
	if (rhs_is_param) {
		bound_function.arguments[0] = lhs_list;
		bound_function.arguments[1] = lhs_list;
		return nullptr;
	}

	bound_function.arguments[0] = lhs_list;
	bound_function.arguments[1] = rhs_list;

	const auto &lhs_child = ListType::GetChildType(bound_function.arguments[0]);
	const auto &rhs_child = ListType::GetChildType(bound_function.arguments[1]);

	if (lhs_child != LogicalType::SQLNULL && rhs_child != LogicalType::SQLNULL && lhs_child != rhs_child) {
		LogicalType common_child;
		if (!LogicalType::TryGetMaxLogicalType(context, lhs_child, rhs_child, common_child)) {
			throw BinderException("'%s' cannot compare lists of different types: '%s' and '%s'", bound_function.name,
			                      lhs_child.ToString(), rhs_child.ToString());
		}
		bound_function.arguments[0] = LogicalType::LIST(common_child);
		bound_function.arguments[1] = LogicalType::LIST(common_child);
	}

	return nullptr;
}